

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O0

void no_screen_flash(dw_rom *rom)

{
  dw_rom *rom_local;
  
  if ((rom->flags[0xe] & 0x20) != 0) {
    printf("Disabling screen flash for spells...\n");
    vpatch(rom,0xd38e,1,0x18);
    vpatch(rom,0xdb40,1,0x18);
  }
  return;
}

Assistant:

static void no_screen_flash(dw_rom *rom)
{
    if (!NO_SCREEN_FLASH(rom))
        return;

    printf("Disabling screen flash for spells...\n");
    /* Change the PPUMASK writes to disable flashing during spells */
    vpatch(rom, 0x0d38e,    1,  0x18);
    vpatch(rom, 0x0db40,    1,  0x18);
}